

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-callback-order.c
# Opt level: O0

int run_test_callback_order(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_88 [8];
  uv_idle_t idle;
  uv_loop_t *loop;
  
  idle.queue[1] = uv_default_loop();
  uv_idle_init((uv_loop_t *)idle.queue[1],(uv_idle_t *)local_88);
  uv_idle_start((uv_idle_t *)local_88,next_tick);
  if (idle_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-callback-order.c"
            ,0x43,"idle_cb_called == 0");
    abort();
  }
  if (timer_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-callback-order.c"
            ,0x44,"timer_cb_called == 0");
    abort();
  }
  uv_run((uv_loop_t *)idle.queue[1],UV_RUN_DEFAULT);
  if (idle_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-callback-order.c"
            ,0x48,"idle_cb_called == 1");
    abort();
  }
  if (timer_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-callback-order.c"
            ,0x49,"timer_cb_called == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-callback-order.c"
            ,0x4b,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(callback_order) {
  uv_loop_t* loop;
  uv_idle_t idle;

  loop = uv_default_loop();
  uv_idle_init(loop, &idle);
  uv_idle_start(&idle, next_tick);

  ASSERT(idle_cb_called == 0);
  ASSERT(timer_cb_called == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(idle_cb_called == 1);
  ASSERT(timer_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}